

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_font * rf_load_ttf_font_from_file
                    (rf_font *__return_storage_ptr__,char *filename,int font_size,
                    rf_font_antialias antialias,rf_allocator allocator,rf_allocator temp_allocator,
                    rf_io_callbacks io)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_allocator temp_allocator_00;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  _Bool _Var5;
  rf_int rVar6;
  void *font_file_data;
  uint uStack_a4;
  uint uStack_74;
  
  __return_storage_ptr__->glyphs = (rf_glyph_info *)0x0;
  __return_storage_ptr__->glyphs_count = 0;
  (__return_storage_ptr__->texture).mipmaps = 0;
  (__return_storage_ptr__->texture).format = 0;
  *(undefined8 *)&(__return_storage_ptr__->texture).valid = 0;
  __return_storage_ptr__->base_size = 0;
  (__return_storage_ptr__->texture).id = 0;
  (__return_storage_ptr__->texture).width = 0;
  (__return_storage_ptr__->texture).height = 0;
  *(undefined8 *)&__return_storage_ptr__->valid = 0;
  _Var5 = rf_is_file_extension(filename,".ttf");
  if ((!_Var5) && (_Var5 = rf_is_file_extension(filename,".otf"), !_Var5)) {
    return __return_storage_ptr__;
  }
  rVar6 = (*io.file_size_proc)(io.user_data,filename);
  rVar1.proc_name = "rf_load_ttf_font_from_file";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x5c45;
  auVar4._8_8_ = (ulong)uStack_74 << 0x20;
  auVar4._0_8_ = (long)(int)rVar6;
  auVar4._16_8_ = 0;
  font_file_data =
       (*temp_allocator.allocator_proc)
                 (&temp_allocator,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
  _Var5 = (*io.read_file_proc)(io.user_data,filename,font_file_data,(long)(int)rVar6);
  if (_Var5) {
    temp_allocator_00.allocator_proc = temp_allocator.allocator_proc;
    temp_allocator_00.user_data = temp_allocator.user_data;
    rf_load_ttf_font_from_data
              (__return_storage_ptr__,font_file_data,0x40,antialias,(int *)&DAT_00179380,0x60,
               allocator,temp_allocator_00);
    rf_gfx_set_texture_filter(__return_storage_ptr__->texture,RF_FILTER_POINT);
  }
  rVar2.proc_name = "rf_load_ttf_font_from_file";
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.line_in_file = 0x5c4f;
  rVar3.size_to_allocate_or_reallocate = 0;
  rVar3.pointer_to_free_or_realloc = font_file_data;
  rVar3._16_8_ = (ulong)uStack_a4 << 0x20;
  (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_load_ttf_font_from_file(const char* filename, int font_size, rf_font_antialias antialias, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_font font = {0};

    if (rf_is_file_extension(filename, ".ttf") || rf_is_file_extension(filename, ".otf"))
    {
        int file_size = RF_FILE_SIZE(io, filename);
        void* data = RF_ALLOC(temp_allocator, file_size);

        if (RF_READ_FILE(io, filename, data, file_size))
        {
            font = rf_load_ttf_font_from_data(data, RF_DEFAULT_FONT_SIZE, antialias, (int[]) RF_BUILTIN_FONT_CHARS, RF_BUILTIN_CODEPOINTS_COUNT, allocator, temp_allocator);

            // By default we set point filter (best performance)
            rf_set_texture_filter(font.texture, RF_FILTER_POINT);
        }

        RF_FREE(temp_allocator, data);
    }

    return font;
}